

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDF::getObject(QPDF *this,QPDFObjGen og)

{
  bool bVar1;
  pointer pMVar2;
  size_type sVar3;
  pointer ppVar4;
  QPDF *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> pVar6;
  QPDFObjectHandle QVar7;
  int local_80 [2];
  QPDF *local_78;
  undefined1 local_70 [24];
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> result;
  shared_ptr<QPDFObject> local_40;
  _Self local_30;
  _Self local_28;
  iterator it;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  it._M_node = (_Base_ptr)og;
  this_local = in_RDX;
  og_local = (QPDFObjGen)this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)og);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
       ::find(&pMVar2->obj_cache,(key_type *)&this_local);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                     ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)og);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
       ::end(&pMVar2->obj_cache);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator->
                       (&local_28);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&(ppVar4->second).object);
    _Var5._M_pi = extraout_RDX;
  }
  else {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)og);
    if ((pMVar2->parsed & 1U) != 0) {
      pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)og);
      sVar3 = std::
              map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
              ::count(&pMVar2->xref_table,(key_type *)&this_local);
      if (sVar3 == 0) {
        QPDFObject::create<QPDF_Null>();
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&local_40);
        std::shared_ptr<QPDFObject>::~shared_ptr(&local_40);
        _Var5._M_pi = extraout_RDX_00;
        goto LAB_0037dea7;
      }
    }
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       ((unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)og);
    local_78 = this_local;
    QPDFObject::create<QPDF_Unresolved>((QPDFObject *)local_70,(QPDF *)og,(QPDFObjGen)this_local);
    local_80[1] = 0xffffffff;
    local_80[0] = -1;
    pVar6 = std::
            map<QPDFObjGen,QPDF::ObjCache,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
            ::try_emplace<std::shared_ptr<QPDFObject>,int,int>
                      ((map<QPDFObjGen,QPDF::ObjCache,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,QPDF::ObjCache>>>
                        *)&pMVar2->obj_cache,(key_type *)&this_local,
                       (shared_ptr<QPDFObject> *)local_70,local_80 + 1,local_80);
    local_70._16_8_ = pVar6.first._M_node;
    result.first._M_node._0_1_ = pVar6.second;
    std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_70);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_> *)
                        (local_70 + 0x10));
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,&(ppVar4->second).object);
    _Var5._M_pi = extraout_RDX_01;
  }
LAB_0037dea7:
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::getObject(QPDFObjGen og)
{
    if (auto it = m->obj_cache.find(og); it != m->obj_cache.end()) {
        return {it->second.object};
    } else if (m->parsed && !m->xref_table.count(og)) {
        return QPDFObject::create<QPDF_Null>();
    } else {
        auto result =
            m->obj_cache.try_emplace(og, QPDFObject::create<QPDF_Unresolved>(this, og), -1, -1);
        return {result.first->second.object};
    }
}